

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

int Mio_CollectRootsNewDefault3(int nInputs,Vec_Ptr_t **pvNames,Vec_Wrd_t **pvTruths)

{
  uint uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  word wVar4;
  undefined4 *puVar5;
  uint uVar6;
  uint uVar7;
  Mio_Library_t *pLib;
  void *__ptr;
  Mio_Gate_t *pGate;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Vec_Wrd_t *pVVar10;
  word *pwVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib == (Mio_Library_t *)0x0) {
    return 0;
  }
  uVar6 = Mio_LibraryReadGateNum(pLib);
  __ptr = calloc((long)(int)uVar6,8);
  for (pGate = Mio_LibraryReadGates(pLib); pGate != (Mio_Gate_t *)0x0;
      pGate = Mio_GateReadNext(pGate)) {
    *(Mio_Gate_t **)((long)__ptr + (long)pGate->Cell * 8) = pGate;
  }
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  uVar14 = 8;
  if (6 < uVar6 - 1) {
    uVar14 = uVar6;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = uVar14;
  if (uVar14 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)(int)uVar14 << 3);
  }
  pVVar8->pArray = ppvVar9;
  *pvNames = pVVar8;
  iVar13 = uVar6 * 4;
  pVVar10 = (Vec_Wrd_t *)malloc(0x10);
  iVar12 = 0x10;
  if (0xe < uVar6 * 4 - 1) {
    iVar12 = iVar13;
  }
  pVVar10->nCap = iVar12;
  if (iVar12 == 0) {
    pwVar11 = (word *)0x0;
  }
  else {
    pwVar11 = (word *)malloc((long)iVar12 << 3);
  }
  pVVar10->pArray = pwVar11;
  pVVar10->nSize = iVar13;
  memset(pwVar11,0,(long)iVar13 << 3);
  *pvTruths = pVVar10;
  uVar14 = 0;
  if (0 < (int)uVar6) {
    uVar15 = 0;
    uVar14 = 0;
    do {
      puVar2 = *(undefined8 **)((long)__ptr + uVar15 * 8);
      if ((*(int *)((long)puVar2 + 0x44) <= nInputs) && (puVar2[7] == 0)) {
        pVVar8 = *pvNames;
        pvVar3 = (void *)*puVar2;
        uVar1 = pVVar8->nSize;
        if (uVar1 == pVVar8->nCap) {
          if ((int)uVar1 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
            }
            pVVar8->pArray = ppvVar9;
            pVVar8->nCap = 0x10;
          }
          else {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar1 << 4);
            }
            pVVar8->pArray = ppvVar9;
            pVVar8->nCap = uVar1 * 2;
          }
        }
        else {
          ppvVar9 = pVVar8->pArray;
        }
        iVar12 = pVVar8->nSize;
        pVVar8->nSize = iVar12 + 1;
        ppvVar9[iVar12] = pvVar3;
        if ((int)uVar14 < 0) {
LAB_003df8b3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar7 = uVar14 * 4;
        uVar1 = (*pvTruths)->nSize;
        if (uVar1 == uVar7 || SBORROW4(uVar1,uVar7) != (int)(uVar1 + uVar14 * -4) < 0)
        goto LAB_003df8b3;
        uVar14 = uVar14 + 1;
        pwVar11 = (*pvTruths)->pArray + uVar7;
        iVar12 = *(int *)((long)puVar2 + 0x44);
        if (iVar12 < 7) {
          uVar16 = *(undefined4 *)(puVar2 + 0xd);
          uVar17 = *(undefined4 *)((long)puVar2 + 0x6c);
          *(undefined4 *)(pwVar11 + 2) = uVar16;
          *(undefined4 *)((long)pwVar11 + 0x14) = uVar17;
          *(undefined4 *)(pwVar11 + 3) = uVar16;
          *(undefined4 *)((long)pwVar11 + 0x1c) = uVar17;
          uVar18 = uVar16;
          uVar19 = uVar17;
        }
        else {
          if (iVar12 != 8) {
            if (iVar12 == 7) {
              wVar4 = *(word *)puVar2[0xd];
              pwVar11[2] = wVar4;
              *pwVar11 = wVar4;
              wVar4 = *(word *)(puVar2[0xd] + 8);
              pwVar11[3] = wVar4;
              pwVar11[1] = wVar4;
            }
            goto LAB_003df81d;
          }
          puVar5 = (undefined4 *)puVar2[0xd];
          uVar16 = *puVar5;
          uVar17 = puVar5[1];
          uVar18 = puVar5[2];
          uVar19 = puVar5[3];
          wVar4 = *(word *)(puVar5 + 6);
          pwVar11[2] = *(word *)(puVar5 + 4);
          pwVar11[3] = wVar4;
        }
        *(undefined4 *)pwVar11 = uVar16;
        *(undefined4 *)((long)pwVar11 + 4) = uVar17;
        *(undefined4 *)(pwVar11 + 1) = uVar18;
        *(undefined4 *)((long)pwVar11 + 0xc) = uVar19;
      }
LAB_003df81d:
      uVar15 = uVar15 + 1;
    } while (uVar6 != uVar15);
  }
  if (uVar14 != uVar6) {
    __assert_fail("iGate == nGates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x337,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
  }
  uVar14 = (*pvTruths)->nSize;
  if (0 < (int)uVar14) {
    pwVar11 = (*pvTruths)->pArray;
    if (*pwVar11 != 0) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                    ,0x338,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    if (4 < uVar14) {
      if (pwVar11[4] != 0xffffffffffffffff) {
        __assert_fail("Vec_WrdEntry(*pvTruths, 4) == ~(word)0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                      ,0x339,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
      }
      if (8 < uVar14) {
        if (pwVar11[8] != 0xaaaaaaaaaaaaaaaa) {
          __assert_fail("Vec_WrdEntry(*pvTruths, 8) == s_Truths6[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x33a,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
        }
        if (0xc < uVar14) {
          if (pwVar11[0xc] != 0x5555555555555555) {
            __assert_fail("Vec_WrdEntry(*pvTruths, 12) == ~s_Truths6[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x33b,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)")
            ;
          }
          if (__ptr == (void *)0x0) {
            return uVar6;
          }
          free(__ptr);
          return uVar6;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
}

Assistant:

int Mio_CollectRootsNewDefault3( int nInputs, Vec_Ptr_t ** pvNames, Vec_Wrd_t ** pvTruths )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    int i, iGate = 0, nGates = pLib ? Mio_LibraryReadGateNum( pLib ) : 0;
    Mio_Gate_t * pGate0, ** ppGates; word * pTruth;
    if ( pLib == NULL )
        return 0;
    ppGates = ABC_CALLOC( Mio_Gate_t *, nGates );
    Mio_LibraryForEachGate( pLib, pGate0 )
        ppGates[pGate0->Cell] = pGate0;
    *pvNames  = Vec_PtrAlloc( nGates );
    *pvTruths = Vec_WrdStart( nGates * 4 );
    for ( i = 0; i < nGates; i++ )
    {
        pGate0 = ppGates[i];
        if ( pGate0->nInputs > nInputs || pGate0->pTwin ) // skip large and multi-output
            continue;
        Vec_PtrPush( *pvNames, pGate0->pName );
        pTruth = Vec_WrdEntryP( *pvTruths, iGate++*4 );
        if ( pGate0->nInputs <= 6 )
            pTruth[0] = pTruth[1] = pTruth[2] = pTruth[3] = pGate0->uTruth;
        else if ( pGate0->nInputs == 7 )
        {
            pTruth[0] = pTruth[2] = pGate0->pTruth[0];
            pTruth[1] = pTruth[3] = pGate0->pTruth[1];
        }
        else if ( pGate0->nInputs == 8 )
            memcpy( pTruth, pGate0->pTruth, (size_t)(4*sizeof(word)) );
    }
    assert( iGate == nGates );
    assert( Vec_WrdEntry(*pvTruths,  0) ==        0 );
    assert( Vec_WrdEntry(*pvTruths,  4) == ~(word)0 );
    assert( Vec_WrdEntry(*pvTruths,  8) ==  s_Truths6[0] );
    assert( Vec_WrdEntry(*pvTruths, 12) == ~s_Truths6[0] );
    ABC_FREE( ppGates );
    return nGates;
}